

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void pgraph_load_pipe(int cnum,uint32_t addr,uint32_t *data,int num)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  pvVar1 = nva_cards[cnum]->bar0;
  *(uint32_t *)((long)pvVar1 + 0x400f50) = addr;
  uVar4 = 0;
  uVar2 = (ulong)(uint)num;
  if (num < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    *(uint32_t *)((long)pvVar1 + 0x400f54) = data[uVar4];
  }
  iVar3 = 0;
  while (*(int *)((long)pvVar1 + 0x400700) != 0) {
    iVar3 = iVar3 + 1;
    if (iVar3 == 10000) {
      printf("PIPE write hang on %04x: %08x\n",addr,(ulong)*(uint *)((long)pvVar1 + 0x400700));
      pvVar1 = nva_cards[cnum]->bar0;
    }
  }
  return;
}

Assistant:

void pgraph_load_pipe(int cnum, uint32_t addr, uint32_t *data, int num) {
	nva_wr32(cnum, 0x400f50, addr);
	for (int i = 0; i < num; i++)
		nva_wr32(cnum, 0x400f54, data[i]);
	int ctr = 0;
	while (nva_rd32(cnum, 0x400700)) {
		ctr++;
		if (ctr == 10000) {
			printf("PIPE write hang on %04x: %08x\n", addr, nva_rd32(cnum, 0x400700));
		}
	}
}